

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O3

void __thiscall
Js::ProbeContainer::DispatchProbeHandlers(ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  ProbeList *pPVar1;
  List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  Probe *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  bVar3 = CanDispatchHalt(this,pHaltState);
  if (bVar3) {
    InitializeLocation(this,pHaltState,true);
    bVar3 = InterpreterHaltState::IsValid(pHaltState);
    if (bVar3) {
      pPVar1 = this->diagProbeList;
      this_00 = this->pendingProbeList;
      if (0 < (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              count) {
        lVar6 = 0;
        do {
          pPVar2 = (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>
                   ).buffer[lVar6];
          iVar4 = (**(pPVar2->super_HaltCallback)._vptr_HaltCallback)(pPVar2);
          if ((char)iVar4 != '\0') {
            JsUtil::
            List<Js::Probe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(this_00,0);
            iVar4 = (this_00->
                    super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count;
            (this_00->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
            buffer[iVar4] = pPVar2;
            (this_00->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
            count = iVar4 + 1;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pPVar1->
                         super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                         count);
      }
      if (0 < (this_00->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              count) {
        iVar4 = 0;
        do {
          if (this->haltCallbackProbe != (HaltCallback *)0x0) {
            iVar5 = (*this->haltCallbackProbe->_vptr_HaltCallback[3])();
            if ((char)iVar5 == '\0') {
              StepController::Deactivate(&this->debugManager->stepController,pHaltState);
              AsyncBreakController::Deactivate(&this->debugManager->asyncBreakController);
              (*this->haltCallbackProbe->_vptr_HaltCallback[1])(this->haltCallbackProbe,pHaltState);
            }
          }
        } while ((this->IsNextStatementChanged != true) &&
                (iVar4 = iVar4 + 1,
                iVar4 < (this_00->
                        super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).
                        count));
      }
    }
    (this->pendingProbeList->
    super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
    DestroyLocation(this);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchProbeHandlers(InterpreterHaltState* pHaltState)
    {
        if (!CanDispatchHalt(pHaltState))
        {
            return;
        }

        TryFinally([&]()
        {
            InitializeLocation(pHaltState);

            if (pHaltState->IsValid())
            {
                Js::ProbeList * localPendingProbeList = this->pendingProbeList;
                diagProbeList->Map([pHaltState, localPendingProbeList](int index, Probe * probe)
                {
                    if (probe->CanHalt(pHaltState))
                    {
                        localPendingProbeList->Add(probe);
                    }
                });

                if (localPendingProbeList->Count() != 0)
                {
                    localPendingProbeList->MapUntil([&](int index, Probe * probe)
                    {
                        if (haltCallbackProbe && !haltCallbackProbe->IsInClosedState())
                        {
                            debugManager->stepController.Deactivate(pHaltState);
                            debugManager->asyncBreakController.Deactivate();
                            haltCallbackProbe->DispatchHalt(pHaltState);
                        }
                        // If SetNextStatement happened between multiple BPs on same location, IP changed so rest of dispatch are not valid.
                        return this->IsSetNextStatementCalled();
                    });
                }
            }
        },
        [&](bool)
        {
            pendingProbeList->Clear();
            DestroyLocation();
        });
    }